

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Env * leveldb::Env::Default(void)

{
  int iVar1;
  SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv> *this;
  
  if (Default()::env_container == '\0') {
    this = (SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv> *)&Default()::env_container;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      anon_unknown_1::SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv>::SingletonEnv(this);
      __cxa_guard_release(&Default()::env_container);
    }
  }
  return (Env *)&Default::env_container;
}

Assistant:

Env* Env::Default() {
  static PosixDefaultEnv env_container;
  return env_container.env();
}